

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O0

GTreeNode * g_tree_first_node(GTree *tree)

{
  GTree *local_20;
  GTreeNode *tmp;
  GTree *tree_local;
  
  if (tree->root == (GTreeNode *)0x0) {
    tree_local = (GTree *)0x0;
  }
  else {
    for (local_20 = (GTree *)tree->root; *(guint8 *)((long)&local_20->key_compare_data + 1) != '\0';
        local_20 = (GTree *)local_20->key_destroy_func) {
    }
    tree_local = local_20;
  }
  return (GTreeNode *)tree_local;
}

Assistant:

static inline GTreeNode *g_tree_first_node (GTree *tree)
{
    GTreeNode *tmp;

    if (!tree->root)
        return NULL;

    tmp = tree->root;

    while (tmp->left_child)
        tmp = tmp->left;

    return tmp;
}